

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::GrowNoAnnotate
          (RepeatedField<unsigned_long> *this,bool was_soo,int old_size,int new_size)

{
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 this_00;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar1;
  long lVar2;
  unsigned_long *__src;
  undefined8 uVar3;
  string *psVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  LogMessage local_48 [16];
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *local_38;
  
  iVar6 = 1;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar6 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar6 < new_size) {
    psVar4 = (string *)0x0;
  }
  else {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)new_size,(long)iVar6,"new_size > old_capacity");
  }
  if (psVar4 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
               ,0x4a2,*(undefined8 *)(psVar4 + 8),*(undefined8 *)psVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48)
    ;
  }
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    this_00.arena = internal::SooRep::soo_arena(&this->soo_rep_);
  }
  else {
    paVar1 = &heap_rep(this)->field_0;
    this_00 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1)paVar1->arena;
  }
  if (new_size < 1) {
    new_size = 1;
  }
  else if (iVar6 < 0x3ffffffc) {
    if (iVar6 < 0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                 ,0x488,0x28,"capacity == 0 || capacity >= lower_limit");
      uVar3 = _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                        ((LogMessageFatal *)local_48);
      absl::lts_20240722::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(uVar3,1," ");
      _ZN4absl12lts_2024072212log_internal10LogMessagelsIiTnNSt9enable_ifIXntsr4absl16HasAbslStringifyIT_EE5valueEiE4typeELi0EEERS2_RKS5_
                (uVar3);
      goto LAB_00266ea3;
    }
    iVar6 = iVar6 * 2 + 1;
    if (new_size < iVar6) {
      new_size = iVar6;
    }
  }
  else {
    new_size = 0x7fffffff;
  }
  uVar7 = (ulong)new_size;
  uVar5 = uVar7 * 8;
  if (this_00.arena == (Arena *)0x0) {
    if ((uVar7 & 0x1fffffff80000000) == 0) {
      psVar4 = (string *)0x0;
    }
    else {
      psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         (uVar7 & 0x1fffffffffffffff,0x7fffffff,
                          "(bytes - kHeapRepHeaderSize) / sizeof(Element) <= static_cast<size_t>(std::numeric_limits<int>::max())"
                         );
    }
    if (psVar4 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                 ,0x4b1,*(undefined8 *)(psVar4 + 8),*(undefined8 *)psVar4);
      absl::lts_20240722::log_internal::LogMessage::operator<<
                (local_48,(char (*) [59])
                          "Requested size is too large to fit element count into int.");
LAB_00266ea3:
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_48);
    }
    uVar7 = uVar7 * 8 + 8;
    lVar2 = __tls_get_addr(&PTR_004d45e8);
    if (*(code **)(lVar2 + 0x28) == (code *)0x0) {
      paVar1 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)operator_new(uVar7);
    }
    else {
      auVar8 = (**(code **)(lVar2 + 0x28))(uVar7,*(undefined8 *)(lVar2 + 0x30));
      paVar1 = auVar8._0_8_;
      uVar5 = auVar8._8_8_ - 8;
    }
    uVar5 = uVar5 >> 3;
    if (0x7ffffffe < uVar5) {
      uVar5 = 0x7fffffff;
    }
    new_size = (int)uVar5;
  }
  else {
    paVar1 = (anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *)
             Arena::AllocateForArray(this_00.arena,uVar5 + 8);
  }
  paVar1->arena = (Arena *)this_00;
  if (0 < old_size) {
    local_38 = paVar1 + 1;
    __src = elements(this,was_soo);
    memcpy(local_38,__src,(ulong)(uint)old_size << 3);
  }
  if (!was_soo) {
    InternalDeallocate<false>(this);
  }
  internal::SooRep::set_non_soo(&this->soo_rep_,was_soo,new_size,paVar1 + 1);
  return;
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}